

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O0

pair<unsigned_int,_unsigned_int> __thiscall
FMB::FiniteModelMultiSorted::getDomainConstant(FiniteModelMultiSorted *this,Term *t)

{
  bool bVar1;
  string *psVar2;
  UserErrorException *in_RDI;
  pair<unsigned_int,_unsigned_int> pair;
  undefined1 in_stack_00000267;
  Term *in_stack_00000268;
  pair<unsigned_int,_unsigned_int> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff7c;
  pair<unsigned_int,_unsigned_int> local_8;
  
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>(&local_8);
  bVar1 = Lib::
          DHMap<Kernel::Term_*,_std::pair<unsigned_int,_unsigned_int>,_Lib::DefaultHash,_Lib::DefaultHash2>
          ::find((DHMap<Kernel::Term_*,_std::pair<unsigned_int,_unsigned_int>,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),(Term **)in_RDI,
                 in_stack_ffffffffffffff68);
  if (!bVar1) {
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff78);
    psVar2 = (string *)__cxa_allocate_exception(0x50);
    Kernel::Term::toString_abi_cxx11_(in_stack_00000268,(bool)in_stack_00000267);
    std::operator+((char *)CONCAT44(in_stack_ffffffffffffff7c,uVar3),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff7c,uVar3),(char *)in_RDI);
    Lib::UserErrorException::Exception(in_RDI,psVar2);
    __cxa_throw(psVar2,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  return local_8;
}

Assistant:

std::pair<unsigned,unsigned> getDomainConstant(Term* t)
  {
    std::pair<unsigned,unsigned> pair;
    if(_domainConstantsRev.find(t,pair)) return pair;
    USER_ERROR("Evaluated to "+t->toString()+" when expected a domain constant, probably a partial model");
  }